

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O3

FT_Error FT_GlyphLoader_CreateExtra(FT_GlyphLoader loader)

{
  FT_Vector *__s;
  FT_UInt FVar1;
  
  FVar1 = loader->max_points;
  if (FVar1 * 2 == 0) {
    (loader->base).extra_points = (FT_Vector *)0x0;
    __s = (FT_Vector *)0x0;
  }
  else {
    if (0x7ffffff < FVar1 * 2) {
      (loader->base).extra_points = (FT_Vector *)0x0;
      return 10;
    }
    __s = (FT_Vector *)(*loader->memory->alloc)(loader->memory,(ulong)(FVar1 << 5));
    if (__s == (FT_Vector *)0x0) {
      (loader->base).extra_points = (FT_Vector *)0x0;
      return 0x40;
    }
    memset(__s,0,(ulong)(FVar1 << 5));
    (loader->base).extra_points = __s;
    FVar1 = loader->max_points;
  }
  loader->use_extra = '\x01';
  (loader->base).extra_points2 = __s + FVar1;
  FT_GlyphLoader_Adjust_Points(loader);
  return 0;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CreateExtra( FT_GlyphLoader  loader )
  {
    FT_Error   error;
    FT_Memory  memory = loader->memory;


    if ( !FT_NEW_ARRAY( loader->base.extra_points, 2 * loader->max_points ) )
    {
      loader->use_extra          = 1;
      loader->base.extra_points2 = loader->base.extra_points +
                                   loader->max_points;

      FT_GlyphLoader_Adjust_Points( loader );
    }
    return error;
  }